

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

void __thiscall slang::ast::DriverVisitor::handle(DriverVisitor *this,ValueExpressionBase *expr)

{
  undefined1 *puVar1;
  char *pcVar2;
  unsigned_long *puVar3;
  undefined4 uVar4;
  ValueSymbol *this_00;
  SubroutineSymbol *pSVar5;
  Scope *pSVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  Symbol *pSVar9;
  bool bVar10;
  ulong pos0;
  long lVar11;
  ulong uVar12;
  Scope *pSVar13;
  ulong uVar14;
  uint uVar15;
  ValueSymbol *pVVar16;
  ulong hash;
  long lVar17;
  ulong uVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar23 [16];
  SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
  drivers;
  const_iterator it;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  range;
  ValueSymbol *local_180;
  long local_178;
  undefined8 local_170;
  undefined1 local_138 [16];
  Symbol *local_128;
  SyntaxNode local_118;
  const_iterator local_f0;
  undefined1 local_b0 [128];
  
  this_00 = expr->symbol;
  puVar1 = &(this->visitedValues).super_Storage.field_0x48;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this_00;
  hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((this->visitedValues).field_0x50 & 0x3f);
  lVar11 = *(long *)&(this->visitedValues).field_0x60;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  uVar12 = *(ulong *)&(this->visitedValues).field_0x58;
  uVar14 = 0;
  uVar18 = pos0;
  do {
    pcVar2 = (char *)(lVar11 + uVar18 * 0x10);
    cVar19 = (char)uVar4;
    auVar23[0] = -(*pcVar2 == cVar19);
    cVar20 = (char)((uint)uVar4 >> 8);
    auVar23[1] = -(pcVar2[1] == cVar20);
    cVar21 = (char)((uint)uVar4 >> 0x10);
    auVar23[2] = -(pcVar2[2] == cVar21);
    cVar22 = (char)((uint)uVar4 >> 0x18);
    auVar23[3] = -(pcVar2[3] == cVar22);
    auVar23[4] = -(pcVar2[4] == cVar19);
    auVar23[5] = -(pcVar2[5] == cVar20);
    auVar23[6] = -(pcVar2[6] == cVar21);
    auVar23[7] = -(pcVar2[7] == cVar22);
    auVar23[8] = -(pcVar2[8] == cVar19);
    auVar23[9] = -(pcVar2[9] == cVar20);
    auVar23[10] = -(pcVar2[10] == cVar21);
    auVar23[0xb] = -(pcVar2[0xb] == cVar22);
    auVar23[0xc] = -(pcVar2[0xc] == cVar19);
    auVar23[0xd] = -(pcVar2[0xd] == cVar20);
    auVar23[0xe] = -(pcVar2[0xe] == cVar21);
    auVar23[0xf] = -(pcVar2[0xf] == cVar22);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      lVar17 = *(long *)&(this->visitedValues).field_0x68 + uVar18 * 0x78;
      do {
        uVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        if (this_00 == *(ValueSymbol **)(lVar17 + (ulong)uVar7 * 8)) {
          bVar10 = lVar17 + (ulong)uVar7 * 8 == 0;
          goto LAB_0014eabc;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
    }
    bVar10 = true;
    if ((*(byte *)(uVar18 * 0x10 + lVar11 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar17 = uVar18 + uVar14;
    uVar14 = uVar14 + 1;
    uVar18 = lVar17 + 1U & uVar12;
  } while (uVar14 <= uVar12);
LAB_0014eabc:
  if (bVar10) {
    local_180 = this_00;
    if (*(ulong *)&(this->visitedValues).field_0x78 < *(ulong *)&(this->visitedValues).field_0x70) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
      ::nosize_unchecked_emplace_at<slang::ast::ValueSymbol_const*>
                ((locator *)local_b0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                  *)puVar1,(arrays_type *)&(this->visitedValues).field_0x50,pos0,hash,&local_180);
      puVar1 = &(this->visitedValues).field_0x78;
      *(long *)puVar1 = *(long *)puVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::ast::ValueSymbol_const*>
                ((locator *)local_b0,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                  *)puVar1,hash,&local_180);
    }
    if (bVar10) {
      pSVar5 = this->sub;
      if (((((pSVar5->super_Scope).compilation)->options).flags.m_bits & 0x1000) != 0) {
        pSVar13 = &pSVar5->super_Scope;
        pVVar16 = this_00;
        do {
          pSVar6 = (pVVar16->super_Symbol).parentScope;
          if (pSVar6 == (Scope *)0x0) break;
          pVVar16 = (ValueSymbol *)pSVar6->thisSym;
        } while ((pVVar16->super_Symbol).kind == StatementBlock);
        if (pSVar5 == (SubroutineSymbol *)0x0) {
          pSVar13 = (Scope *)0x0;
        }
        if (pSVar6 == pSVar13) {
          return;
        }
      }
      local_180 = (ValueSymbol *)&stack0xfffffffffffffe98;
      local_178 = 0;
      local_170 = 2;
      ValueSymbol::drivers
                ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                  *)local_b0,this_00);
      local_f0.map = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)
                     local_b0._0_8_;
      SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                (&local_f0.path.path,(Base *)(local_b0 + 8));
      while( true ) {
        local_138._0_8_ = local_b0._64_8_;
        SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                  ((SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *)(local_138 + 8),
                   (Base *)(local_b0 + 0x48));
        bVar10 = IntervalMapDetails::Path::operator==(&local_f0.path,(Path *)(local_138 + 8));
        if ((SyntaxNode *)local_138._8_8_ != &local_118) {
          operator_delete((void *)local_138._8_8_);
        }
        if (bVar10) break;
        lVar11 = local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                 len * 0x10;
        if (*(SubroutineSymbol **)
             (*(long *)(*(long *)((undefined1 *)
                                  ((long)local_f0.path.path.
                                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                         .data_ - 0x10) + lVar11) + 0x80 +
                       (ulong)*(uint *)((undefined1 *)
                                        ((long)local_f0.path.path.
                                               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                               .data_ - 4) + lVar11) * 8) + 8) == this->sub) {
          uVar12 = (ulong)*(uint *)((undefined1 *)
                                    ((long)local_f0.path.path.
                                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                                           .data_ + lVar11) + -4);
          lVar11 = *(long *)((undefined1 *)
                             ((long)local_f0.path.path.
                                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                    data_ + lVar11) + -0x10);
          puVar3 = (unsigned_long *)(lVar11 + uVar12 * 0x10);
          local_138._0_8_ = *puVar3;
          local_138._8_8_ = puVar3[1];
          local_128 = *(Symbol **)(lVar11 + 0x80 + uVar12 * 8);
          SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
          ::
          emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                    ((SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                      *)&local_180,
                     (pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>
                      *)local_138);
        }
        IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::operator++
                  (&local_f0);
      }
      if (local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_f0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   firstElement) {
        operator_delete(local_f0.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      if (local_178 != 0) {
        pSVar9 = &local_180->super_Symbol;
        lVar11 = local_178 * 6;
        pVVar16 = local_180;
        do {
          ValueSymbol::addDriver
                    (this_00,Procedural,*(DriverBitRange *)&pVVar16->super_Symbol,
                     *(Expression **)(pVVar16->super_Symbol).name._M_str,this->procedure,
                     this->callExpr);
          pVVar16 = (ValueSymbol *)&(pVVar16->super_Symbol).location;
        } while (pVVar16 != (ValueSymbol *)(&pSVar9->kind + lVar11));
      }
      if ((ValueDriver *)local_b0._72_8_ != (ValueDriver *)(local_b0 + 0x60)) {
        operator_delete((void *)local_b0._72_8_);
      }
      if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x20) {
        operator_delete((void *)local_b0._8_8_);
      }
      if (local_180 != (ValueSymbol *)&stack0xfffffffffffffe98) {
        operator_delete(local_180);
      }
    }
  }
  return;
}

Assistant:

void handle(const ValueExpressionBase& expr) {
        auto& sym = expr.symbol;
        if (!visitedValues.emplace(&sym).second)
            return;

        if (sub.getCompilation().hasFlag(CompilationFlags::AllowMultiDrivenLocals)) {
            auto scope = sym.getParentScope();
            while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
                scope = scope->asSymbol().getParentScope();

            if (scope == &sub) {
                // This is a local variable of the subroutine,
                // so don't do driver checking.
                return;
            }
        }

        // If the target symbol is driven by the subroutine we're inspecting,
        // add another driver for the procedure we're originally called from.
        SmallVector<std::pair<DriverBitRange, const ValueDriver*>> drivers;
        auto range = sym.drivers();
        for (auto it = range.begin(); it != range.end(); ++it) {
            if ((*it)->containingSymbol == &sub)
                drivers.push_back({it.bounds(), *it});
        }

        // This needs to be a separate loop to avoid mutating the driver map
        // while iterating over it.
        for (auto [bounds, driver] : drivers) {
            sym.addDriver(DriverKind::Procedural, bounds, *driver->prefixExpression, procedure,
                          callExpr);
        }
    }